

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O0

void __thiscall TPZCheckMesh::DependencyReport(TPZCheckMesh *this,int connect,TPZCompElSide *large)

{
  int iVar1;
  int64_t iVar2;
  TPZCompElSide *pTVar3;
  TPZCompEl *pTVar4;
  void *this_00;
  TPZCompElSide *in_RDX;
  int in_ESI;
  long in_RDI;
  int ih;
  int nhigh;
  int eq;
  int neq;
  TPZStack<TPZCompElSide,_10> highdim;
  TPZStack<TPZCompElSide,_10> equal;
  int conind;
  int is;
  int nsmall;
  TPZStack<TPZCompElSide,_10> smalll;
  TPZGeoElSide *in_stack_fffffffffffffcd0;
  TPZCompElSide *in_stack_fffffffffffffcd8;
  TPZStack<TPZCompElSide,_10> *in_stack_fffffffffffffce0;
  TPZCompElSide *in_stack_fffffffffffffce8;
  ostream *in_stack_fffffffffffffd00;
  ostream *in_stack_fffffffffffffd08;
  TPZCompElSide *in_stack_fffffffffffffd10;
  int local_2a8;
  int local_2a0;
  TPZVec<TPZCompElSide> local_298 [6];
  TPZCompElSide local_1d8;
  TPZVec<TPZCompElSide> local_1c8 [6];
  int local_f0;
  int local_ec;
  int local_e8;
  TPZVec<TPZCompElSide> local_d8 [5];
  TPZCompElSide *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  TPZStack<TPZCompElSide,_10>::TPZStack(in_stack_fffffffffffffce0);
  TPZCompElSide::HigherLevelElementList
            (in_stack_fffffffffffffd10,(TPZStack<TPZCompElSide,_10> *)in_stack_fffffffffffffd08,
             (int)((ulong)in_stack_fffffffffffffd00 >> 0x20),(int)in_stack_fffffffffffffd00);
  iVar2 = TPZVec<TPZCompElSide>::NElements(local_d8);
  local_e8 = (int)iVar2;
  for (local_ec = 0; local_ec < local_e8; local_ec = local_ec + 1) {
    pTVar3 = TPZVec<TPZCompElSide>::operator[](local_d8,(long)local_ec);
    pTVar4 = TPZCompElSide::Element(pTVar3);
    pTVar3 = TPZVec<TPZCompElSide>::operator[](local_d8,(long)local_ec);
    iVar1 = TPZCompElSide::Side(pTVar3);
    local_f0 = (**(code **)(*(long *)pTVar4 + 0xa0))(pTVar4,iVar1);
    in_stack_fffffffffffffd10 =
         (TPZCompElSide *)std::operator<<(*(ostream **)(in_RDI + 8),"Connect ");
    in_stack_fffffffffffffd08 =
         (ostream *)std::ostream::operator<<(in_stack_fffffffffffffd10,local_f0);
    in_stack_fffffffffffffd00 = std::operator<<(in_stack_fffffffffffffd08," may depend on ");
    this_00 = (void *)std::ostream::operator<<(in_stack_fffffffffffffd00,in_ESI);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  TPZCompElSide::Reference(in_stack_fffffffffffffce8);
  iVar1 = TPZGeoElSide::Dimension(in_stack_fffffffffffffcd0);
  TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x19f0483);
  if (iVar1 == 1) {
    TPZStack<TPZCompElSide,_10>::TPZStack(in_stack_fffffffffffffce0);
    TPZCompElSide::EqualLevelElementList
              (in_stack_fffffffffffffd10,(TPZStack<TPZCompElSide,_10> *)in_stack_fffffffffffffd08,
               (int)((ulong)in_stack_fffffffffffffd00 >> 0x20),(int)in_stack_fffffffffffffd00);
    TPZCompElSide::TPZCompElSide(&local_1d8,in_RDX);
    TPZStack<TPZCompElSide,_10>::Push(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    TPZStack<TPZCompElSide,_10>::TPZStack(in_stack_fffffffffffffce0);
    iVar2 = TPZVec<TPZCompElSide>::NElements(local_1c8);
    for (local_2a0 = 0; local_2a0 < (int)iVar2; local_2a0 = local_2a0 + 1) {
      TPZVec<TPZCompElSide>::operator[](local_1c8,(long)local_2a0);
      TPZCompElSide::HigherDimensionElementList
                (in_stack_fffffffffffffd10,(TPZStack<TPZCompElSide,_10> *)in_stack_fffffffffffffd08,
                 (int)((ulong)in_stack_fffffffffffffd00 >> 0x20),(int)in_stack_fffffffffffffd00);
    }
    TPZCompElSide::HigherDimensionElementList
              (in_stack_fffffffffffffd10,(TPZStack<TPZCompElSide,_10> *)in_stack_fffffffffffffd08,
               (int)((ulong)in_stack_fffffffffffffd00 >> 0x20),(int)in_stack_fffffffffffffd00);
    iVar2 = TPZVec<TPZCompElSide>::NElements(local_298);
    for (local_2a8 = 0; local_2a8 < (int)iVar2; local_2a8 = local_2a8 + 1) {
      TPZVec<TPZCompElSide>::operator[](local_298,(long)local_2a8);
      DependencyReport((TPZCheckMesh *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                       (int)((ulong)in_RDX >> 0x20),in_stack_ffffffffffffffe0);
    }
    TPZStack<TPZCompElSide,_10>::~TPZStack((TPZStack<TPZCompElSide,_10> *)0x19f06a4);
    TPZStack<TPZCompElSide,_10>::~TPZStack((TPZStack<TPZCompElSide,_10> *)0x19f06b1);
  }
  TPZStack<TPZCompElSide,_10>::~TPZStack((TPZStack<TPZCompElSide,_10> *)0x19f06cf);
  return;
}

Assistant:

void TPZCheckMesh::DependencyReport(int connect, TPZCompElSide & large) {
	
	TPZStack<TPZCompElSide> smalll;
	large.HigherLevelElementList(smalll,1,1);
	int nsmall = smalll.NElements();
	int is;
	for(is=0; is<nsmall; is++) {
		int conind = smalll[is].Element()->ConnectIndex(smalll[is].Side());
		(*fOut) << "Connect " << conind << " may depend on " << connect << endl;
	}
	if(large.Reference().Dimension() == 1) {
		TPZStack<TPZCompElSide> equal;
		large.EqualLevelElementList(equal,1,0);
		equal.Push(large);
		TPZStack<TPZCompElSide> highdim;
		int neq = equal.NElements();
		int eq;
		for(eq=0; eq<neq; eq++) equal[eq].HigherDimensionElementList(highdim,1,0);
		large.HigherDimensionElementList(highdim,1,0);
		int nhigh = highdim.NElements();
		int ih;
		for(ih=0; ih<nhigh; ih++) {
			DependencyReport(connect,highdim[ih]);
		}
	}
}